

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O1

size_t ZSTD_HcFindBestMatch_dedicatedDictSearch_selectMLS
                 (ZSTD_matchState_t *ms,BYTE *ip,BYTE *iLimit,size_t *offsetPtr)

{
  U32 UVar1;
  uint uVar2;
  BYTE *pBVar3;
  ZSTD_matchState_t *pZVar4;
  U32 *pUVar5;
  BYTE *pBVar6;
  BYTE *pBVar7;
  char cVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  size_t sVar12;
  U32 *pUVar13;
  U32 *pUVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  U32 *pUVar19;
  U32 *pUVar20;
  ulong *puVar21;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  uint uVar25;
  U32 UVar26;
  U32 *unaff_R12;
  uint uVar27;
  ulong *puVar28;
  uint uVar29;
  bool bVar30;
  
  uVar9 = (ms->cParams).minMatch;
  if (uVar9 - 6 < 2) {
    uVar25 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
    pBVar3 = (ms->window).base;
    uVar9 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
    UVar1 = (ms->window).lowLimit;
    uVar22 = (uint)((long)ip - (long)pBVar3);
    UVar26 = uVar22 - uVar9;
    if (uVar22 - UVar1 <= uVar9) {
      UVar26 = UVar1;
    }
    if (ms->loadedDictEnd != 0) {
      UVar26 = UVar1;
    }
    uVar9 = uVar22 - uVar25;
    if (uVar22 < uVar25) {
      uVar9 = 0;
    }
    uVar29 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
    pZVar4 = ms->dictMatchState;
    lVar11 = *(long *)ip;
    uVar17 = (ulong)(lVar11 * -0x30e4432340650000) >>
             (0x42U - (char)(pZVar4->cParams).hashLog & 0x3f);
    pUVar5 = ms->chainTable;
    uVar2 = (ms->window).dictLimit;
    pUVar14 = pZVar4->hashTable;
    uVar10 = (ms->cParams).chainLog;
    pUVar20 = ms->hashTable;
    uVar18 = (ulong)ms->nextToUpdate;
    cVar8 = (char)(ms->cParams).hashLog;
    if (ms->nextToUpdate < uVar22) {
      do {
        uVar23 = (ulong)(*(long *)(pBVar3 + uVar18) * -0x30e4432340650000) >> (0x40U - cVar8 & 0x3f)
        ;
        pUVar5[(uint)uVar18 & ~(-1 << ((byte)uVar10 & 0x1f))] = pUVar20[uVar23];
        pUVar20[uVar23] = (uint)uVar18;
        uVar18 = uVar18 + 1;
      } while (uVar18 < ((long)ip - (long)pBVar3 & 0xffffffffU));
    }
    ms->nextToUpdate = uVar22;
    uVar10 = pUVar20[(ulong)(lVar11 * -0x30e4432340650000) >> (-cVar8 & 0x3fU)];
    pUVar20 = (U32 *)0x3;
    if (UVar26 <= uVar10) {
      pUVar19 = (U32 *)0x3;
      do {
        puVar21 = (ulong *)(pBVar3 + uVar10);
        if (*(BYTE *)((long)pUVar19 + (long)puVar21) == ip[(long)pUVar19]) {
          puVar28 = (ulong *)ip;
          if (ip < iLimit + -7) {
            uVar23 = *(ulong *)ip ^ *puVar21;
            uVar18 = 0;
            if (uVar23 != 0) {
              for (; (uVar23 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
              }
            }
            pUVar20 = (U32 *)(uVar18 >> 3 & 0x1fffffff);
            puVar28 = (ulong *)(ip + 8);
            if (*puVar21 == *(ulong *)ip) {
              do {
                puVar21 = puVar21 + 1;
                if (iLimit + -7 <= puVar28) goto LAB_0020b246;
                uVar18 = *puVar28;
                uVar24 = uVar18 ^ *puVar21;
                uVar23 = 0;
                if (uVar24 != 0) {
                  for (; (uVar24 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
                  }
                }
                pUVar20 = (U32 *)((long)puVar28 + ((uVar23 >> 3 & 0x1fffffff) - (long)ip));
                puVar28 = puVar28 + 1;
              } while (*puVar21 == uVar18);
            }
          }
          else {
LAB_0020b246:
            if ((puVar28 < iLimit + -3) && ((int)*puVar21 == (int)*puVar28)) {
              puVar28 = (ulong *)((long)puVar28 + 4);
              puVar21 = (ulong *)((long)puVar21 + 4);
            }
            if ((puVar28 < iLimit + -1) && ((short)*puVar21 == (short)*puVar28)) {
              puVar28 = (ulong *)((long)puVar28 + 2);
              puVar21 = (ulong *)((long)puVar21 + 2);
            }
            if (puVar28 < iLimit) {
              puVar28 = (ulong *)((long)puVar28 + (ulong)((char)*puVar21 == (char)*puVar28));
            }
            pUVar20 = (U32 *)((long)puVar28 - (long)ip);
          }
        }
        else {
          pUVar20 = (U32 *)0x0;
        }
        if ((pUVar19 < pUVar20) &&
           (*offsetPtr = (ulong)((uVar22 + 2) - uVar10), pUVar19 = pUVar20,
           ip + (long)pUVar20 == iLimit)) {
          bVar30 = false;
        }
        else {
          pUVar20 = pUVar19;
          if (uVar9 < uVar10) {
            uVar10 = pUVar5[uVar10 & uVar25 - 1];
            bVar30 = true;
          }
          else {
            bVar30 = false;
          }
        }
      } while (((bVar30) && (uVar29 = uVar29 - 1, UVar26 <= uVar10)) &&
              (pUVar19 = pUVar20, uVar29 != 0));
    }
    pBVar6 = (pZVar4->window).nextSrc;
    pBVar7 = (pZVar4->window).base;
    iVar15 = ((int)pBVar6 - (int)pBVar7) - uVar2;
    lVar11 = 0;
    do {
      lVar11 = lVar11 + 1;
    } while (lVar11 != 3);
    uVar9 = pUVar14[uVar17 * 4 + 3];
    pUVar5 = pZVar4->chainTable;
    if (uVar29 == 0) {
      uVar18 = 0;
    }
    else {
      uVar23 = 3;
      if (uVar29 < 3) {
        uVar23 = (ulong)uVar29;
      }
      uVar18 = 0;
      pUVar19 = (U32 *)ip;
      do {
        uVar25 = pUVar14[uVar17 * 4 + uVar18];
        if ((ulong)uVar25 == 0) {
          bVar30 = false;
          pUVar19 = pUVar20;
        }
        else {
          if (*(int *)(pBVar7 + uVar25) == *(int *)ip) {
            sVar12 = ZSTD_count_2segments
                               (ip + 4,(BYTE *)((long)(pBVar7 + uVar25) + 4),iLimit,pBVar6,
                                pBVar3 + uVar2);
            pUVar13 = (U32 *)(sVar12 + 4);
          }
          else {
            pUVar13 = (U32 *)0x0;
          }
          bVar30 = true;
          if (pUVar20 < pUVar13) {
            *offsetPtr = (ulong)((uVar22 + iVar15 + 2) - uVar25);
            bVar30 = ip + (long)pUVar13 != iLimit;
            pUVar20 = pUVar13;
            if (!bVar30) {
              pUVar19 = pUVar13;
            }
          }
        }
        if (!bVar30) {
          return (size_t)pUVar19;
        }
        uVar18 = uVar18 + 1;
      } while (uVar23 != uVar18);
    }
    uVar25 = uVar9 & 0xff;
    uVar29 = uVar29 - (int)uVar18;
    if (uVar25 <= uVar29) {
      uVar29 = uVar25;
    }
    if (uVar29 != 0) {
      uVar17 = 0;
      do {
        uVar17 = uVar17 + 1;
      } while (uVar29 != uVar17);
      iVar16 = *(int *)ip;
      lVar11 = 0;
      do {
        uVar25 = pUVar5[(ulong)(uVar9 >> 8) + lVar11];
        if (*(int *)(pBVar7 + uVar25) == iVar16) {
          sVar12 = ZSTD_count_2segments
                             (ip + 4,pBVar7 + (ulong)uVar25 + 4,iLimit,pBVar6,pBVar3 + uVar2);
          pUVar14 = (U32 *)(sVar12 + 4);
        }
        else {
          pUVar14 = (U32 *)0x0;
        }
        bVar30 = pUVar20 < pUVar14;
        if (bVar30) {
          *offsetPtr = (ulong)((uVar22 + iVar15 + 2) - uVar25);
          pUVar20 = pUVar14;
        }
      } while ((!bVar30 || ip + (long)pUVar14 != iLimit) &&
              (lVar11 = lVar11 + 1, uVar29 != (uint)lVar11));
    }
  }
  else if (uVar9 == 5) {
    uVar25 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
    pBVar3 = (ms->window).base;
    uVar9 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
    UVar1 = (ms->window).lowLimit;
    uVar22 = (uint)((long)ip - (long)pBVar3);
    UVar26 = uVar22 - uVar9;
    if (uVar22 - UVar1 <= uVar9) {
      UVar26 = UVar1;
    }
    if (ms->loadedDictEnd != 0) {
      UVar26 = UVar1;
    }
    uVar9 = uVar22 - uVar25;
    if (uVar22 < uVar25) {
      uVar9 = 0;
    }
    uVar29 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
    pZVar4 = ms->dictMatchState;
    lVar11 = *(long *)ip;
    uVar17 = (ulong)(lVar11 * -0x30e4432345000000) >>
             (0x42U - (char)(pZVar4->cParams).hashLog & 0x3f);
    pUVar5 = ms->chainTable;
    uVar2 = (ms->window).dictLimit;
    pUVar14 = pZVar4->hashTable;
    uVar10 = (ms->cParams).chainLog;
    pUVar19 = ms->hashTable;
    uVar18 = (ulong)ms->nextToUpdate;
    cVar8 = (char)(ms->cParams).hashLog;
    if (ms->nextToUpdate < uVar22) {
      do {
        uVar23 = (ulong)(*(long *)(pBVar3 + uVar18) * -0x30e4432345000000) >> (0x40U - cVar8 & 0x3f)
        ;
        pUVar5[(uint)uVar18 & ~(-1 << ((byte)uVar10 & 0x1f))] = pUVar19[uVar23];
        pUVar19[uVar23] = (uint)uVar18;
        uVar18 = uVar18 + 1;
      } while (uVar18 < ((long)ip - (long)pBVar3 & 0xffffffffU));
    }
    ms->nextToUpdate = uVar22;
    uVar10 = pUVar19[(ulong)(lVar11 * -0x30e4432345000000) >> (-cVar8 & 0x3fU)];
    pUVar20 = (U32 *)0x3;
    if (UVar26 <= uVar10) {
      pUVar20 = (U32 *)0x3;
      do {
        puVar21 = (ulong *)(pBVar3 + uVar10);
        if (*(BYTE *)((long)pUVar20 + (long)puVar21) == ip[(long)pUVar20]) {
          puVar28 = (ulong *)ip;
          if (ip < iLimit + -7) {
            uVar23 = *(ulong *)ip ^ *puVar21;
            uVar18 = 0;
            if (uVar23 != 0) {
              for (; (uVar23 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
              }
            }
            pUVar19 = (U32 *)(uVar18 >> 3 & 0x1fffffff);
            puVar28 = (ulong *)(ip + 8);
            if (*puVar21 == *(ulong *)ip) {
              do {
                puVar21 = puVar21 + 1;
                if (iLimit + -7 <= puVar28) goto LAB_0020b722;
                uVar18 = *puVar28;
                uVar24 = uVar18 ^ *puVar21;
                uVar23 = 0;
                if (uVar24 != 0) {
                  for (; (uVar24 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
                  }
                }
                pUVar19 = (U32 *)((long)puVar28 + ((uVar23 >> 3 & 0x1fffffff) - (long)ip));
                puVar28 = puVar28 + 1;
              } while (*puVar21 == uVar18);
            }
          }
          else {
LAB_0020b722:
            if ((puVar28 < iLimit + -3) && ((int)*puVar21 == (int)*puVar28)) {
              puVar28 = (ulong *)((long)puVar28 + 4);
              puVar21 = (ulong *)((long)puVar21 + 4);
            }
            if ((puVar28 < iLimit + -1) && ((short)*puVar21 == (short)*puVar28)) {
              puVar28 = (ulong *)((long)puVar28 + 2);
              puVar21 = (ulong *)((long)puVar21 + 2);
            }
            if (puVar28 < iLimit) {
              puVar28 = (ulong *)((long)puVar28 + (ulong)((char)*puVar21 == (char)*puVar28));
            }
            pUVar19 = (U32 *)((long)puVar28 - (long)ip);
          }
        }
        else {
          pUVar19 = (U32 *)0x0;
        }
        if ((pUVar20 < pUVar19) &&
           (*offsetPtr = (ulong)((uVar22 + 2) - uVar10), pUVar20 = pUVar19,
           ip + (long)pUVar19 == iLimit)) {
          bVar30 = false;
        }
        else if (uVar9 < uVar10) {
          uVar10 = pUVar5[uVar10 & uVar25 - 1];
          bVar30 = true;
        }
        else {
          bVar30 = false;
        }
      } while (((bVar30) && (uVar29 = uVar29 - 1, UVar26 <= uVar10)) && (uVar29 != 0));
    }
    pBVar6 = (pZVar4->window).nextSrc;
    pBVar7 = (pZVar4->window).base;
    iVar15 = ((int)pBVar6 - (int)pBVar7) - uVar2;
    lVar11 = 0;
    do {
      lVar11 = lVar11 + 1;
    } while (lVar11 != 3);
    uVar9 = pUVar14[uVar17 * 4 + 3];
    pUVar5 = pZVar4->chainTable;
    if (uVar29 == 0) {
      uVar18 = 0;
    }
    else {
      uVar23 = 3;
      if (uVar29 < 3) {
        uVar23 = (ulong)uVar29;
      }
      uVar18 = 0;
      do {
        uVar25 = pUVar14[uVar17 * 4 + uVar18];
        if ((ulong)uVar25 == 0) {
          bVar30 = false;
          pUVar19 = pUVar20;
        }
        else {
          if (*(int *)(pBVar7 + uVar25) == *(int *)ip) {
            sVar12 = ZSTD_count_2segments
                               (ip + 4,(BYTE *)((long)(pBVar7 + uVar25) + 4),iLimit,pBVar6,
                                pBVar3 + uVar2);
            pUVar13 = (U32 *)(sVar12 + 4);
          }
          else {
            pUVar13 = (U32 *)0x0;
          }
          bVar30 = true;
          if (pUVar20 < pUVar13) {
            *offsetPtr = (ulong)((uVar22 + iVar15 + 2) - uVar25);
            bVar30 = ip + (long)pUVar13 != iLimit;
            pUVar20 = pUVar13;
            if (!bVar30) {
              pUVar19 = pUVar13;
            }
          }
        }
        if (!bVar30) {
          return (size_t)pUVar19;
        }
        uVar18 = uVar18 + 1;
      } while (uVar23 != uVar18);
    }
    uVar25 = uVar9 & 0xff;
    uVar29 = uVar29 - (int)uVar18;
    if (uVar25 <= uVar29) {
      uVar29 = uVar25;
    }
    if (uVar29 != 0) {
      uVar17 = 0;
      do {
        uVar17 = uVar17 + 1;
      } while (uVar29 != uVar17);
      iVar16 = *(int *)ip;
      lVar11 = 0;
      do {
        uVar25 = pUVar5[(ulong)(uVar9 >> 8) + lVar11];
        if (*(int *)(pBVar7 + uVar25) == iVar16) {
          sVar12 = ZSTD_count_2segments
                             (ip + 4,pBVar7 + (ulong)uVar25 + 4,iLimit,pBVar6,pBVar3 + uVar2);
          pUVar14 = (U32 *)(sVar12 + 4);
        }
        else {
          pUVar14 = (U32 *)0x0;
        }
        bVar30 = pUVar20 < pUVar14;
        if (bVar30) {
          *offsetPtr = (ulong)((uVar22 + iVar15 + 2) - uVar25);
          pUVar20 = pUVar14;
        }
      } while ((!bVar30 || ip + (long)pUVar14 != iLimit) &&
              (lVar11 = lVar11 + 1, uVar29 != (uint)lVar11));
    }
  }
  else {
    uVar25 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
    pBVar3 = (ms->window).base;
    uVar9 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
    UVar1 = (ms->window).lowLimit;
    uVar22 = (uint)((long)ip - (long)pBVar3);
    UVar26 = uVar22 - uVar9;
    if (uVar22 - UVar1 <= uVar9) {
      UVar26 = UVar1;
    }
    if (ms->loadedDictEnd != 0) {
      UVar26 = UVar1;
    }
    uVar9 = uVar22 - uVar25;
    if (uVar22 < uVar25) {
      uVar9 = 0;
    }
    uVar29 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
    pZVar4 = ms->dictMatchState;
    uVar17 = (ulong)((uint)(*(int *)ip * -0x61c8864f) >>
                    (0x22U - (char)(pZVar4->cParams).hashLog & 0x1f));
    pUVar5 = ms->chainTable;
    uVar2 = (ms->window).dictLimit;
    pUVar14 = pZVar4->hashTable;
    uVar10 = (ms->cParams).chainLog;
    pUVar20 = ms->hashTable;
    pUVar19 = (U32 *)(ulong)ms->nextToUpdate;
    cVar8 = (char)(ms->cParams).hashLog;
    if (ms->nextToUpdate < uVar22) {
      unaff_R12 = (U32 *)((long)ip - (long)pBVar3 & 0xffffffff);
      do {
        uVar27 = (uint)(*(int *)(pBVar3 + (long)pUVar19) * -0x61c8864f) >> (0x20U - cVar8 & 0x1f);
        pUVar5[(uint)pUVar19 & ~(-1 << ((byte)uVar10 & 0x1f))] = pUVar20[uVar27];
        pUVar20[uVar27] = (uint)pUVar19;
        pUVar19 = (U32 *)((long)pUVar19 + 1);
      } while (pUVar19 < unaff_R12);
    }
    ms->nextToUpdate = uVar22;
    iVar15 = *(int *)ip;
    uVar10 = pUVar20[(uint)(iVar15 * -0x61c8864f) >> (-cVar8 & 0x1fU)];
    if (uVar10 < UVar26) {
      pUVar20 = (U32 *)0x3;
    }
    else {
      pUVar20 = (U32 *)0x3;
      do {
        puVar21 = (ulong *)(pBVar3 + uVar10);
        if (*(BYTE *)((long)pUVar20 + (long)puVar21) == ip[(long)pUVar20]) {
          puVar28 = (ulong *)ip;
          if (ip < iLimit + -7) {
            uVar23 = *(ulong *)ip ^ *puVar21;
            uVar18 = 0;
            if (uVar23 != 0) {
              for (; (uVar23 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
              }
            }
            unaff_R12 = (U32 *)(uVar18 >> 3 & 0x1fffffff);
            puVar28 = (ulong *)(ip + 8);
            if (*puVar21 == *(ulong *)ip) {
              do {
                puVar21 = puVar21 + 1;
                if (iLimit + -7 <= puVar28) goto LAB_0020b888;
                uVar18 = *puVar28;
                uVar24 = uVar18 ^ *puVar21;
                uVar23 = 0;
                if (uVar24 != 0) {
                  for (; (uVar24 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
                  }
                }
                unaff_R12 = (U32 *)((long)puVar28 + ((uVar23 >> 3 & 0x1fffffff) - (long)ip));
                puVar28 = puVar28 + 1;
              } while (*puVar21 == uVar18);
            }
          }
          else {
LAB_0020b888:
            if ((puVar28 < iLimit + -3) && ((int)*puVar21 == (int)*puVar28)) {
              puVar28 = (ulong *)((long)puVar28 + 4);
              puVar21 = (ulong *)((long)puVar21 + 4);
            }
            if ((puVar28 < iLimit + -1) && ((short)*puVar21 == (short)*puVar28)) {
              puVar28 = (ulong *)((long)puVar28 + 2);
              puVar21 = (ulong *)((long)puVar21 + 2);
            }
            if (puVar28 < iLimit) {
              puVar28 = (ulong *)((long)puVar28 + (ulong)((char)*puVar21 == (char)*puVar28));
            }
            unaff_R12 = (U32 *)((long)puVar28 - (long)ip);
          }
        }
        else {
          unaff_R12 = (U32 *)0x0;
        }
        if ((pUVar20 < unaff_R12) &&
           (*offsetPtr = (ulong)((uVar22 + 2) - uVar10), pUVar20 = unaff_R12,
           ip + (long)unaff_R12 == iLimit)) {
          bVar30 = false;
        }
        else if (uVar9 < uVar10) {
          uVar10 = pUVar5[uVar10 & uVar25 - 1];
          bVar30 = true;
        }
        else {
          bVar30 = false;
        }
      } while (((bVar30) && (uVar29 = uVar29 - 1, UVar26 <= uVar10)) && (uVar29 != 0));
    }
    pBVar6 = (pZVar4->window).nextSrc;
    pBVar7 = (pZVar4->window).base;
    iVar16 = ((int)pBVar6 - (int)pBVar7) - uVar2;
    lVar11 = 0;
    do {
      lVar11 = lVar11 + 1;
    } while (lVar11 != 3);
    uVar9 = pUVar14[uVar17 * 4 + 3];
    pUVar5 = pZVar4->chainTable;
    if (uVar29 == 0) {
      uVar18 = 0;
    }
    else {
      uVar23 = 3;
      if (uVar29 < 3) {
        uVar23 = (ulong)uVar29;
      }
      uVar18 = 0;
      do {
        uVar25 = pUVar14[uVar17 * 4 + uVar18];
        if ((ulong)uVar25 == 0) {
          bVar30 = false;
          unaff_R12 = pUVar20;
        }
        else {
          if (*(int *)(pBVar7 + uVar25) == iVar15) {
            sVar12 = ZSTD_count_2segments
                               (ip + 4,(BYTE *)((long)(pBVar7 + uVar25) + 4),iLimit,pBVar6,
                                pBVar3 + uVar2);
            pUVar19 = (U32 *)(sVar12 + 4);
          }
          else {
            pUVar19 = (U32 *)0x0;
          }
          bVar30 = true;
          if (pUVar20 < pUVar19) {
            *offsetPtr = (ulong)((uVar22 + iVar16 + 2) - uVar25);
            bVar30 = ip + (long)pUVar19 != iLimit;
            pUVar20 = pUVar19;
            if (!bVar30) {
              unaff_R12 = pUVar19;
            }
          }
        }
        if (!bVar30) {
          return (size_t)unaff_R12;
        }
        uVar18 = uVar18 + 1;
      } while (uVar23 != uVar18);
    }
    uVar25 = uVar9 & 0xff;
    uVar29 = uVar29 - (int)uVar18;
    if (uVar25 <= uVar29) {
      uVar29 = uVar25;
    }
    if (uVar29 != 0) {
      uVar17 = 0;
      do {
        uVar17 = uVar17 + 1;
      } while (uVar29 != uVar17);
      lVar11 = 0;
      do {
        uVar25 = pUVar5[(ulong)(uVar9 >> 8) + lVar11];
        if (*(int *)(pBVar7 + uVar25) == iVar15) {
          sVar12 = ZSTD_count_2segments
                             (ip + 4,pBVar7 + (ulong)uVar25 + 4,iLimit,pBVar6,pBVar3 + uVar2);
          pUVar14 = (U32 *)(sVar12 + 4);
        }
        else {
          pUVar14 = (U32 *)0x0;
        }
        bVar30 = pUVar20 < pUVar14;
        if (bVar30) {
          *offsetPtr = (ulong)((iVar16 + uVar22 + 2) - uVar25);
          pUVar20 = pUVar14;
        }
      } while ((!bVar30 || ip + (long)pUVar14 != iLimit) &&
              (lVar11 = lVar11 + 1, uVar29 != (uint)lVar11));
    }
  }
  return (size_t)pUVar20;
}

Assistant:

static size_t ZSTD_HcFindBestMatch_dedicatedDictSearch_selectMLS (
                        ZSTD_matchState_t* ms,
                        const BYTE* ip, const BYTE* const iLimit,
                        size_t* offsetPtr)
{
    switch(ms->cParams.minMatch)
    {
    default : /* includes case 3 */
    case 4 : return ZSTD_HcFindBestMatch_generic(ms, ip, iLimit, offsetPtr, 4, ZSTD_dedicatedDictSearch);
    case 5 : return ZSTD_HcFindBestMatch_generic(ms, ip, iLimit, offsetPtr, 5, ZSTD_dedicatedDictSearch);
    case 7 :
    case 6 : return ZSTD_HcFindBestMatch_generic(ms, ip, iLimit, offsetPtr, 6, ZSTD_dedicatedDictSearch);
    }
}